

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O2

FT_UInt32 * tt_cmap14_get_def_chars(TT_CMap cmap,FT_Byte *p,FT_Memory memory)

{
  FT_Byte *pFVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  FT_UInt FVar6;
  FT_Error FVar7;
  FT_CMap_Class pFVar8;
  FT_CMap_Class pFVar9;
  int iVar10;
  FT_UInt32 FVar11;
  int iVar12;
  bool bVar13;
  uint local_34;
  
  FVar6 = tt_cmap14_def_char_count(p);
  bVar2 = *p;
  bVar3 = p[1];
  bVar4 = p[2];
  bVar5 = p[3];
  FVar7 = tt_cmap14_ensure((TT_CMap14)cmap,FVar6 + 1,memory);
  if (FVar7 == 0) {
    local_34 = (uint)bVar5;
    iVar10 = ((uint)bVar4 << 8 | (uint)bVar3 << 0x10 | (uint)bVar2 << 0x18) + local_34;
    pFVar8 = cmap[1].cmap.clazz;
    pFVar9 = pFVar8;
    while (bVar13 = iVar10 != 0, iVar10 = iVar10 + -1, bVar13) {
      pFVar1 = p + 4;
      FVar11 = (uint)p[6] | (uint)p[5] << 8 | (uint)p[4] << 0x10;
      iVar12 = p[7] + 1;
      do {
        *(FT_UInt32 *)&pFVar9->size = FVar11;
        FVar11 = FVar11 + 1;
        pFVar9 = (FT_CMap_Class)((long)&pFVar9->size + 4);
        iVar12 = iVar12 + -1;
        p = pFVar1;
      } while (iVar12 != 0);
    }
    *(FT_UInt32 *)&pFVar9->size = 0;
  }
  else {
    pFVar8 = (FT_CMap_Class)0x0;
  }
  return (FT_UInt32 *)pFVar8;
}

Assistant:

static FT_UInt32*
  tt_cmap14_get_def_chars( TT_CMap    cmap,
                           FT_Byte*   p,
                           FT_Memory  memory )
  {
    TT_CMap14   cmap14 = (TT_CMap14) cmap;
    FT_UInt32   numRanges;
    FT_UInt     cnt;
    FT_UInt32*  q;


    cnt       = tt_cmap14_def_char_count( p );
    numRanges = (FT_UInt32)TT_NEXT_ULONG( p );

    if ( tt_cmap14_ensure( cmap14, ( cnt + 1 ), memory ) )
      return NULL;

    for ( q = cmap14->results; numRanges > 0; numRanges-- )
    {
      FT_UInt32  uni = (FT_UInt32)TT_NEXT_UINT24( p );


      cnt = FT_NEXT_BYTE( p ) + 1;
      do
      {
        q[0]  = uni;
        uni  += 1;
        q    += 1;

      } while ( --cnt != 0 );
    }
    q[0] = 0;

    return cmap14->results;
  }